

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavParser.cpp
# Opt level: O0

void __thiscall WavParser::Initialize(WavParser *this,ifstream *in_File)

{
  bool bVar1;
  WavDataType WVar2;
  WavHeaderTypeGroup WVar3;
  WavFile *this_00;
  StandardWavHead *this_01;
  NonPcmHead *this_02;
  ExtensibleWavHead *this_03;
  ExtensibleNoFactHead *this_04;
  StandardBWFHead *this_05;
  ExtensibleBWFHead *this_06;
  RF64Header *this_07;
  element_type *peVar4;
  ifstream *in_File_local;
  WavParser *this_local;
  
  bVar1 = std::ios::operator_cast_to_bool((ios *)(in_File + *(long *)(*(long *)in_File + -0x18)));
  if (bVar1) {
    WVar3 = WavParserHelper::GetWavHeaderType(in_File);
    this->m_HeaderTypeGroup = WVar3;
    WVar2 = WavParserHelper::GetWavDataType(in_File);
    this->m_DataType = WVar2;
    if (((this->m_HeaderTypeGroup).MajorType != Invalid) && (this->m_DataType != Invalid)) {
      this_00 = (WavFile *)operator_new(0x20);
      WavFile::WavFile(this_00);
      std::__shared_ptr<WavFile,_(__gnu_cxx::_Lock_policy)2>::reset<WavFile>
                (&(this->m_File).super___shared_ptr<WavFile,_(__gnu_cxx::_Lock_policy)2>,this_00);
      switch((this->m_HeaderTypeGroup).MajorType) {
      case Standard:
        this_01 = (StandardWavHead *)operator_new(0x4c);
        StandardWavHead::StandardWavHead(this_01);
        peVar4 = std::__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_File);
        peVar4->Header = (IWavHeader *)this_01;
        break;
      case NonPCM:
        if ((this->m_HeaderTypeGroup).SubType == Normal) {
          this_02 = (NonPcmHead *)operator_new(0x62);
          NonPcmHead::NonPcmHead(this_02);
          peVar4 = std::__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_File);
          peVar4->Header = (IWavHeader *)this_02;
        }
        break;
      case Extensible:
        if ((this->m_HeaderTypeGroup).SubType == Normal) {
          this_03 = (ExtensibleWavHead *)operator_new(0x7c);
          ExtensibleWavHead::ExtensibleWavHead(this_03);
          peVar4 = std::__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_File);
          peVar4->Header = (IWavHeader *)this_03;
        }
        else if ((this->m_HeaderTypeGroup).SubType == NoFact) {
          this_04 = (ExtensibleNoFactHead *)operator_new(0x68);
          ExtensibleNoFactHead::ExtensibleNoFactHead(this_04);
          peVar4 = std::__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_File);
          peVar4->Header = (IWavHeader *)this_04;
        }
        break;
      case Bwf:
        if ((this->m_HeaderTypeGroup).SubType == Normal) {
          this_05 = (StandardBWFHead *)operator_new(0x312);
          StandardBWFHead::StandardBWFHead(this_05);
          peVar4 = std::__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_File);
          peVar4->Header = (IWavHeader *)this_05;
        }
        else if ((this->m_HeaderTypeGroup).SubType == Extensible) {
          this_06 = (ExtensibleBWFHead *)operator_new(0x342);
          ExtensibleBWFHead::ExtensibleBWFHead(this_06);
          peVar4 = std::__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_File);
          peVar4->Header = (IWavHeader *)this_06;
        }
        else if ((this->m_HeaderTypeGroup).SubType == RF64) {
          this_07 = (RF64Header *)operator_new(0x31c);
          RF64Header::RF64Header(this_07);
          peVar4 = std::__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_File);
          peVar4->Header = (IWavHeader *)this_07;
        }
        break;
      default:
        peVar4 = std::__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<WavFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_File);
        peVar4->Header = (IWavHeader *)0x0;
      }
    }
    return;
  }
  __assert_fail("in_File",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jazzlost[P]WavParser/Src/WavParser.cpp"
                ,0xe,"void WavParser::Initialize(std::ifstream &)");
}

Assistant:

void WavParser::Initialize(std::ifstream &in_File)
{
	assert(in_File);

	m_HeaderTypeGroup = WavParserHelper::GetWavHeaderType(in_File);

	m_DataType = WavParserHelper::GetWavDataType(in_File);

	if (m_HeaderTypeGroup.MajorType == WavHeaderType::Invalid || m_DataType == WavDataType::Invalid)
		return;

	m_File.reset(new WavFile());

	switch (m_HeaderTypeGroup.MajorType)
	{
	case WavHeaderType::Standard:
		m_File->Header = new StandardWavHead();
		break;
	case WavHeaderType::NonPCM:
		if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Normal)
			m_File->Header = new NonPcmHead();
		//else if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Extensible)
		//	m_File->Header = new ExtensibleNonPCMHead();
		break;
	case WavHeaderType::Extensible:
		if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Normal)
			m_File->Header = new ExtensibleWavHead();
		else if (m_HeaderTypeGroup.SubType == WavHeaderSubType::NoFact)
			m_File->Header = new ExtensibleNoFactHead();
		break;
	case WavHeaderType::Bwf:
		if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Normal)
			m_File->Header = new StandardBWFHead();
		else if (m_HeaderTypeGroup.SubType == WavHeaderSubType::Extensible)
			m_File->Header = new ExtensibleBWFHead();
		else if (m_HeaderTypeGroup.SubType == WavHeaderSubType::RF64)
			m_File->Header = new RF64Header();
		break;
	default:
		m_File->Header = nullptr;
	}

	return;
}